

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i c;
  short sVar11;
  parasail_result_t *ppVar12;
  __m256i *palVar13;
  __m256i *ptr;
  __m256i *b;
  __m256i *__dest;
  __m256i *ptr_00;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  undefined4 uVar24;
  uint uVar25;
  undefined4 uVar26;
  short sVar27;
  uint uVar28;
  ulong size;
  ulong uVar29;
  undefined2 uVar30;
  undefined2 uVar31;
  undefined2 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd74;
  int iVar41;
  __m256i *ptr_01;
  undefined4 uVar42;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 uVar43;
  long local_228;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar1 = (profile->profile16).score;
    if (pvVar1 == (void *)0x0) {
      parasail_sw_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar25 = profile->s1Len;
        uVar21 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_1();
        }
        else {
          uVar20 = uVar21 + 0xf;
          iVar41 = ppVar2->min;
          iVar16 = -iVar41;
          if (iVar41 != -open && SBORROW4(iVar41,-open) == iVar41 + open < 0) {
            iVar16 = open;
          }
          sVar11 = 0x7ffe - (short)ppVar2->max;
          ppVar12 = parasail_result_new_table1((uint)uVar20 & 0x7ffffff0,s2Len);
          if (ppVar12 != (parasail_result_t *)0x0) {
            size = uVar20 >> 4;
            ppVar12->flag = ppVar12->flag | 0x10220404;
            palVar13 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            __dest = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            if (ptr_00 != (__m256i *)0x0 &&
                ((__dest != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar13 != (__m256i *)0x0))) {
              uVar30 = (undefined2)open;
              uVar31 = (undefined2)gap;
              uVar23 = iVar16 - 0x7fff;
              uVar32 = (undefined2)uVar23;
              uVar15 = uVar23 & 0xffff;
              uVar28 = (uint)size;
              auVar33._0_2_ = (undefined2)-(gap * uVar28);
              auVar33._2_2_ = auVar33._0_2_;
              auVar33._4_2_ = auVar33._0_2_;
              auVar33._6_2_ = auVar33._0_2_;
              auVar33._8_2_ = auVar33._0_2_;
              auVar33._10_2_ = auVar33._0_2_;
              auVar33._12_2_ = auVar33._0_2_;
              auVar33._14_2_ = auVar33._0_2_;
              auVar33._16_2_ = auVar33._0_2_;
              auVar33._18_2_ = auVar33._0_2_;
              auVar33._20_2_ = auVar33._0_2_;
              auVar33._22_2_ = auVar33._0_2_;
              auVar33._24_2_ = auVar33._0_2_;
              auVar33._26_2_ = auVar33._0_2_;
              auVar33._28_2_ = auVar33._0_2_;
              auVar33._30_2_ = auVar33._0_2_;
              auVar33 = vpand_avx2(auVar33,_DAT_008d4840);
              auVar33 = vpaddsw_avx2(ZEXT432(uVar15),auVar33);
              alVar7[1]._0_4_ = uVar23;
              alVar7[0] = in_stack_fffffffffffffd68;
              alVar7[1]._4_4_ = in_stack_fffffffffffffd74;
              alVar7[2] = (longlong)palVar13;
              alVar7[3]._0_4_ = open;
              alVar7[3]._4_4_ = in_stack_fffffffffffffd84;
              ptr_01 = palVar13;
              parasail_memset___m256i(b,alVar7,size);
              c[1]._0_4_ = uVar23;
              c[0] = in_stack_fffffffffffffd68;
              c[1]._4_4_ = in_stack_fffffffffffffd74;
              c[2] = (longlong)ptr_01;
              c[3]._0_4_ = open;
              c[3]._4_4_ = in_stack_fffffffffffffd84;
              parasail_memset___m256i(palVar13,c,size);
              auVar5._2_2_ = uVar31;
              auVar5._0_2_ = uVar31;
              auVar5._4_2_ = uVar31;
              auVar5._6_2_ = uVar31;
              auVar5._8_2_ = uVar31;
              auVar5._10_2_ = uVar31;
              auVar5._12_2_ = uVar31;
              auVar5._14_2_ = uVar31;
              auVar5._16_2_ = uVar31;
              auVar5._18_2_ = uVar31;
              auVar5._20_2_ = uVar31;
              auVar5._22_2_ = uVar31;
              auVar5._24_2_ = uVar31;
              auVar5._26_2_ = uVar31;
              auVar5._28_2_ = uVar31;
              auVar5._30_2_ = uVar31;
              auVar39 = ZEXT3264(auVar5);
              auVar10._2_2_ = uVar30;
              auVar10._0_2_ = uVar30;
              auVar10._4_2_ = uVar30;
              auVar10._6_2_ = uVar30;
              auVar10._8_2_ = uVar30;
              auVar10._10_2_ = uVar30;
              auVar10._12_2_ = uVar30;
              auVar10._14_2_ = uVar30;
              auVar10._16_2_ = uVar30;
              auVar10._18_2_ = uVar30;
              auVar10._20_2_ = uVar30;
              auVar10._22_2_ = uVar30;
              auVar10._24_2_ = uVar30;
              auVar10._26_2_ = uVar30;
              auVar10._28_2_ = uVar30;
              auVar10._30_2_ = uVar30;
              auVar38 = ZEXT3264(auVar10);
              alVar7 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar10);
              palVar13 = ptr_00 + (uVar28 - 1);
              uVar17 = size;
              do {
                *palVar13 = alVar7;
                alVar7 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar7,auVar5);
                palVar13 = palVar13 + -1;
                iVar41 = (int)uVar17;
                uVar18 = iVar41 - 1;
                uVar17 = (ulong)uVar18;
              } while (uVar18 != 0 && 0 < iVar41);
              uVar17 = 1;
              if (1 < s2Len) {
                uVar17 = (ulong)(uint)s2Len;
              }
              lVar22 = (ulong)(uVar28 + (uVar28 == 0)) << 5;
              lVar14 = size * (uint)s2Len;
              auVar4._2_2_ = uVar32;
              auVar4._0_2_ = uVar32;
              auVar4._4_2_ = uVar32;
              auVar4._6_2_ = uVar32;
              auVar4._8_2_ = uVar32;
              auVar4._10_2_ = uVar32;
              auVar4._12_2_ = uVar32;
              auVar4._14_2_ = uVar32;
              auVar4._16_2_ = uVar32;
              auVar4._18_2_ = uVar32;
              auVar4._20_2_ = uVar32;
              auVar4._22_2_ = uVar32;
              auVar4._24_2_ = uVar32;
              auVar4._26_2_ = uVar32;
              auVar4._28_2_ = uVar32;
              auVar4._30_2_ = uVar32;
              auVar40 = ZEXT3264(auVar4);
              auVar6._2_2_ = sVar11;
              auVar6._0_2_ = sVar11;
              auVar6._4_2_ = sVar11;
              auVar6._6_2_ = sVar11;
              auVar6._8_2_ = sVar11;
              auVar6._10_2_ = sVar11;
              auVar6._12_2_ = sVar11;
              auVar6._14_2_ = sVar11;
              auVar6._16_2_ = sVar11;
              auVar6._18_2_ = sVar11;
              auVar6._20_2_ = sVar11;
              auVar6._22_2_ = sVar11;
              auVar6._24_2_ = sVar11;
              auVar6._26_2_ = sVar11;
              auVar6._28_2_ = sVar11;
              auVar6._30_2_ = sVar11;
              local_228 = 0;
              uVar29 = 0;
              iVar41 = 0;
              uVar42 = (undefined4)lVar22;
              uVar43 = (undefined4)((ulong)lVar22 >> 0x20);
              auVar5 = auVar4;
              do {
                iVar16 = ppVar2->mapper[(byte)s2[uVar29]];
                alVar7 = b[uVar28 - 1];
                auVar10 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28);
                auVar10 = vpalignr_avx2((undefined1  [32])alVar7,auVar10,0xe);
                lVar19 = 0;
                auVar35._2_2_ = uVar32;
                auVar35._0_2_ = uVar32;
                auVar35._4_2_ = uVar32;
                auVar35._6_2_ = uVar32;
                auVar35._8_2_ = uVar32;
                auVar35._10_2_ = uVar32;
                auVar35._12_2_ = uVar32;
                auVar35._14_2_ = uVar32;
                auVar35._16_2_ = uVar32;
                auVar35._18_2_ = uVar32;
                auVar35._20_2_ = uVar32;
                auVar35._22_2_ = uVar32;
                auVar35._24_2_ = uVar32;
                auVar35._26_2_ = uVar32;
                auVar35._28_2_ = uVar32;
                auVar35._30_2_ = uVar32;
                auVar37 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar36 = vpaddsw_avx2(auVar10,*(undefined1 (*) [32])
                                                  ((long)pvVar1 +
                                                  lVar19 + size * (long)iVar16 * 0x20));
                  auVar10 = *(undefined1 (*) [32])((long)*b + lVar19);
                  auVar8 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar19),
                                        auVar39._0_32_);
                  auVar9 = vpsubsw_avx2(auVar10,auVar38._0_32_);
                  auVar9 = vpmaxsw_avx2(auVar8,auVar9);
                  auVar8 = vpaddsw_avx2(auVar37._0_32_,
                                        *(undefined1 (*) [32])((long)*ptr_00 + lVar19));
                  auVar35 = vpmaxsw_avx2(auVar35,auVar8);
                  auVar36 = vpmaxsw_avx2(auVar9,auVar36);
                  auVar37 = ZEXT3264(auVar36);
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar19) = auVar9;
                  *(undefined1 (*) [32])((long)*ptr + lVar19) = auVar36;
                  lVar19 = lVar19 + 0x20;
                } while (lVar22 != lVar19);
                auVar10 = vperm2i128_avx2(auVar36,auVar36,8);
                auVar36 = vpalignr_avx2(auVar36,auVar10,0xe);
                auVar10 = vpaddsw_avx2(auVar36,(undefined1  [32])*ptr_00);
                auVar10 = vpmaxsw_avx2(auVar35,auVar10);
                iVar16 = 0xe;
                do {
                  auVar35 = vperm2i128_avx2(auVar10,auVar10,0x28);
                  auVar35 = vpalignr_avx2(auVar10,auVar35,0xe);
                  auVar35 = vpaddsw_avx2(auVar33,auVar35);
                  auVar10 = vpmaxsw_avx2(auVar10,auVar35);
                  iVar16 = iVar16 + -1;
                } while (iVar16 != 0);
                auVar35 = vperm2i128_avx2(auVar10,auVar10,0x28);
                auVar10 = vpalignr_avx2(auVar10,auVar35,0xe);
                auVar10 = vpaddsw_avx2(auVar10,ZEXT432(uVar15));
                auVar35 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar36);
                auVar35 = vpmaxsw_avx2(auVar35,auVar10);
                lVar19 = 0;
                lVar22 = local_228;
                do {
                  auVar10 = vpsubsw_avx2(auVar10,auVar39._0_32_);
                  auVar35 = vpsubsw_avx2(auVar35,auVar38._0_32_);
                  auVar10 = vpmaxsw_avx2(auVar10,auVar35);
                  auVar35 = vpmaxsw_avx2(auVar10,*(undefined1 (*) [32])((long)*ptr + lVar19));
                  auVar35 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar35);
                  *(undefined1 (*) [32])((long)*b + lVar19) = auVar35;
                  piVar3 = ((ppVar12->field_4).rowcols)->score_row;
                  auVar34 = auVar35._0_16_;
                  uVar24 = vpextrw_avx(auVar34,0);
                  *(undefined4 *)((long)piVar3 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,1);
                  uVar26 = vpextrw_avx(auVar34,2);
                  *(undefined4 *)((long)piVar3 + lVar14 * 4 + lVar22) = uVar24;
                  *(undefined4 *)((long)piVar3 + lVar14 * 8 + lVar22) = uVar26;
                  uVar24 = vpextrw_avx(auVar34,3);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0xc + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,4);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x10 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,5);
                  uVar26 = vpextrw_avx(auVar34,6);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x14 + lVar22) = uVar24;
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x18 + lVar22) = uVar26;
                  uVar24 = vpextrw_avx(auVar34,7);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x1c + lVar22) = uVar24;
                  auVar34 = auVar35._16_16_;
                  uVar24 = vpextrw_avx(auVar34,0);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x20 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,1);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x24 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,2);
                  uVar26 = vpextrw_avx(auVar34,3);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x28 + lVar22) = uVar24;
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x2c + lVar22) = uVar26;
                  uVar24 = vpextrw_avx(auVar34,4);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x30 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,5);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x34 + lVar22) = uVar24;
                  uVar24 = vpextrw_avx(auVar34,6);
                  uVar26 = vpextrw_avx(auVar34,7);
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x38 + lVar22) = uVar24;
                  *(undefined4 *)((long)piVar3 + lVar14 * 0x3c + lVar22) = uVar26;
                  auVar6 = vpminsw_avx2(auVar6,auVar35);
                  auVar4 = vpmaxsw_avx2(auVar4,auVar35);
                  auVar5 = vpmaxsw_avx2(auVar5,auVar35);
                  lVar19 = lVar19 + 0x20;
                  lVar22 = lVar22 + (ulong)(uint)s2Len * 4;
                } while (CONCAT44(uVar43,uVar42) != lVar19);
                auVar10 = vpcmpgtw_avx2(auVar5,auVar40._0_32_);
                if ((((((((((((((((((((((((((((((((auVar10 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar10 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar10 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar10 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar10 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar10 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar10 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar10 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar10 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar10 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar10 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar10 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar10 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar10 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar10 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar10 >> 0x7f,0) != '\0') ||
                                  (auVar10 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar10 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar10 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar10 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar10 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar10 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar10 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar10 >> 0xbf,0) != '\0') ||
                          (auVar10 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar10 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar10[0x1f] < '\0') {
                  auVar10 = vpermq_avx2(auVar5,0x44);
                  auVar10 = vpmaxsw_avx2(auVar5,auVar10);
                  auVar35 = vpslldq_avx2(auVar10,8);
                  auVar10 = vpmaxsw_avx2(auVar10,auVar35);
                  auVar35 = vpslldq_avx2(auVar10,4);
                  auVar10 = vpmaxsw_avx2(auVar10,auVar35);
                  auVar35 = vpslldq_avx2(auVar10,2);
                  auVar10 = vpmaxsw_avx2(auVar10,auVar35);
                  uVar23 = vpextrw_avx(auVar10._16_16_,7);
                  auVar10 = vpshufhw_avx2(auVar10,0xff);
                  auVar36._8_4_ = 6;
                  auVar36._0_8_ = 0x600000006;
                  auVar36._12_4_ = 6;
                  auVar36._16_4_ = 6;
                  auVar36._20_4_ = 6;
                  auVar36._24_4_ = 6;
                  auVar36._28_4_ = 6;
                  auVar10 = vpermd_avx2(auVar36,auVar10);
                  memcpy(__dest,b,size << 5);
                  auVar40 = ZEXT3264(auVar10);
                  auVar39 = ZEXT3264(CONCAT230(uVar31,CONCAT228(uVar31,CONCAT226(uVar31,CONCAT224(
                                                  uVar31,CONCAT222(uVar31,CONCAT220(uVar31,CONCAT218
                                                  (uVar31,CONCAT216(uVar31,CONCAT214(uVar31,
                                                  CONCAT212(uVar31,CONCAT210(uVar31,CONCAT28(uVar31,
                                                  CONCAT26(uVar31,CONCAT24(uVar31,CONCAT22(uVar31,
                                                  uVar31))))))))))))))));
                  auVar38 = ZEXT3264(CONCAT230(uVar30,CONCAT228(uVar30,CONCAT226(uVar30,CONCAT224(
                                                  uVar30,CONCAT222(uVar30,CONCAT220(uVar30,CONCAT218
                                                  (uVar30,CONCAT216(uVar30,CONCAT214(uVar30,
                                                  CONCAT212(uVar30,CONCAT210(uVar30,CONCAT28(uVar30,
                                                  CONCAT26(uVar30,CONCAT24(uVar30,CONCAT22(uVar30,
                                                  uVar30))))))))))))))));
                  iVar41 = (int)uVar29;
                }
                uVar29 = uVar29 + 1;
                local_228 = local_228 + 4;
                lVar22 = CONCAT44(uVar43,uVar42);
              } while (uVar29 != uVar17);
              sVar27 = (short)uVar23;
              if ((uVar20 & 0x7ffffff0) != 0) {
                uVar20 = 0;
                do {
                  if ((*(short *)((long)*__dest + uVar20 * 2) == sVar27) &&
                     (uVar25 = ((uint)uVar20 & 0xf) * uVar28 + ((uint)(uVar20 >> 4) & 0xfffffff),
                     (int)uVar25 < (int)uVar21)) {
                    uVar21 = (ulong)uVar25;
                  }
                  uVar25 = (uint)uVar21;
                  uVar20 = uVar20 + 1;
                } while ((uVar28 & 0x7ffffff) << 4 != (int)uVar20);
              }
              auVar8._2_2_ = uVar32;
              auVar8._0_2_ = uVar32;
              auVar8._4_2_ = uVar32;
              auVar8._6_2_ = uVar32;
              auVar8._8_2_ = uVar32;
              auVar8._10_2_ = uVar32;
              auVar8._12_2_ = uVar32;
              auVar8._14_2_ = uVar32;
              auVar8._16_2_ = uVar32;
              auVar8._18_2_ = uVar32;
              auVar8._20_2_ = uVar32;
              auVar8._22_2_ = uVar32;
              auVar8._24_2_ = uVar32;
              auVar8._26_2_ = uVar32;
              auVar8._28_2_ = uVar32;
              auVar8._30_2_ = uVar32;
              auVar33 = vpcmpgtw_avx2(auVar8,auVar6);
              auVar9._2_2_ = sVar11;
              auVar9._0_2_ = sVar11;
              auVar9._4_2_ = sVar11;
              auVar9._6_2_ = sVar11;
              auVar9._8_2_ = sVar11;
              auVar9._10_2_ = sVar11;
              auVar9._12_2_ = sVar11;
              auVar9._14_2_ = sVar11;
              auVar9._16_2_ = sVar11;
              auVar9._18_2_ = sVar11;
              auVar9._20_2_ = sVar11;
              auVar9._22_2_ = sVar11;
              auVar9._24_2_ = sVar11;
              auVar9._26_2_ = sVar11;
              auVar9._28_2_ = sVar11;
              auVar9._30_2_ = sVar11;
              auVar5 = vpcmpgtw_avx2(auVar4,auVar9);
              auVar33 = vpor_avx2(auVar5,auVar33);
              if ((((((((((((((((((((((((((((((((auVar33 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar33 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar33 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar33 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar33 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar33 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar33 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar33 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar33 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar33 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar33 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar33 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar33 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar33 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar33 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar33 >> 0x7f,0) != '\0') ||
                                (auVar33 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar33 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar33 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar33 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar33 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar33 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar33 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar33 >> 0xbf,0) != '\0') ||
                        (auVar33 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar33 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar33 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar33 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar33 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                sVar27 = 0;
                iVar41 = 0;
                uVar25 = 0;
              }
              ppVar12->score = (int)sVar27;
              ppVar12->end_query = uVar25;
              ppVar12->end_ref = iVar41;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b);
              parasail_free(ptr);
              parasail_free(ptr_01);
              return ppVar12;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        vH = _mm256_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            vH = _mm256_max_epi16(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}